

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void free_old_nodes(Parser *p)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pPVar3;
  SNode *pSVar4;
  SNode *pSVar5;
  PNode *pPVar6;
  PNode *pn;
  PNode **ppPVar7;
  SNode **ppSVar8;
  SNode *pSVar9;
  SNode **ppSVar10;
  PNode **ppPVar11;
  ulong uVar12;
  
  pPVar3 = (p->pnode_hash).all;
  pSVar9 = (p->snode_hash).all;
  if (pSVar9 != (SNode *)0x0) {
    uVar2 = (p->snode_hash).m;
    do {
      pSVar4 = pSVar9->all_next;
      ppSVar8 = (p->snode_hash).v +
                (ulong)(((uint)(*(int *)&pSVar9->state - *(int *)&p->t->state) >> 3) * -0x11111000 +
                       *(int *)&pSVar9->initial_scope) % (ulong)uVar2;
      do {
        ppSVar10 = ppSVar8;
        pSVar5 = *ppSVar10;
        ppSVar8 = &pSVar5->bucket_next;
      } while (pSVar5 != pSVar9);
      *ppSVar10 = pSVar5->bucket_next;
      pSVar9 = pSVar4;
    } while (pSVar4 != (SNode *)0x0);
  }
  pSVar9 = (p->snode_hash).last_all;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (pSVar4 = pSVar9, pSVar4 != (SNode *)0x0) {
    pSVar9 = pSVar4->all_next;
    puVar1 = &pSVar4->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar4);
    }
  }
  (p->snode_hash).last_all = (p->snode_hash).all;
  (p->snode_hash).all = (SNode *)0x0;
  while (pn = pPVar3, pn != (PNode *)0x0) {
    if ((pn->children).n != 0) {
      uVar12 = 0;
      do {
        while( true ) {
          pPVar3 = (pn->children).v[uVar12];
          pPVar6 = pPVar3->latest;
          if (pPVar3 == pPVar6) break;
          pPVar6->refcount = pPVar6->refcount + 1;
          puVar1 = &pPVar3->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pPVar3);
          }
          (pn->children).v[uVar12] = pPVar6;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (pn->children).n);
    }
    pPVar3 = pn->all_next;
    ppPVar7 = (p->pnode_hash).v +
              (ulong)(uint)(*(int *)&(pn->parse_node).end_skip * 0x10000 +
                            *(int *)&(pn->parse_node).start_loc.s * 0x100 + (pn->parse_node).symbol
                           + *(int *)&pn->initial_scope) % (ulong)(p->pnode_hash).m;
    do {
      ppPVar11 = ppPVar7;
      pPVar6 = *ppPVar11;
      ppPVar7 = &pPVar6->bucket_next;
    } while (pPVar6 != pn);
    *ppPVar11 = pPVar6->bucket_next;
    puVar1 = &pn->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn);
    }
  }
  (p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  return;
}

Assistant:

static void free_old_nodes(Parser *p) {
  uint i, h;
  PNode *pn = p->pnode_hash.all, *tpn, **lpn;
  SNode *sn = p->snode_hash.all, *tsn, **lsn;
  while (sn) {
    h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope);
    lsn = &p->snode_hash.v[h % p->snode_hash.m];
    tsn = sn;
    sn = sn->all_next;
    while (*lsn != tsn) lsn = &(*lsn)->bucket_next;
    *lsn = (*lsn)->bucket_next;
  }
  sn = p->snode_hash.last_all;
  p->snode_hash.last_all = 0;
  while (sn) {
    tsn = sn;
    sn = sn->all_next;
    unref_sn(p, tsn);
  }
  p->snode_hash.last_all = p->snode_hash.all;
  p->snode_hash.all = NULL;
  while (pn) {
    for (i = 0; i < pn->children.n; i++) {
      while (pn->children.v[i] != pn->children.v[i]->latest) {
        tpn = pn->children.v[i]->latest;
        ref_pn(tpn);
        unref_pn(p, pn->children.v[i]);
        pn->children.v[i] = tpn;
      }
    }
    h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope);
    lpn = &p->pnode_hash.v[h % p->pnode_hash.m];
    tpn = pn;
    pn = pn->all_next;
    while (*lpn != tpn) lpn = &(*lpn)->bucket_next;
    *lpn = (*lpn)->bucket_next;
    unref_pn(p, tpn);
  }
  p->pnode_hash.n = 0;
  p->pnode_hash.all = NULL;
}